

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIEditBox::updateAbsolutePosition(CGUIEditBox *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = *(int *)&this->field_0x40;
  iVar2 = *(int *)&this->field_0x44;
  iVar3 = *(int *)&this->field_0x48;
  iVar4 = *(int *)&this->field_0x4c;
  IGUIElement::updateAbsolutePosition((IGUIElement *)this);
  if ((((iVar1 == *(int *)&this->field_0x40) && (iVar2 == *(int *)&this->field_0x44)) &&
      (iVar3 == *(int *)&this->field_0x48)) && (iVar4 == *(int *)&this->field_0x4c)) {
    return;
  }
  calculateFrameRect(this);
  breakText(this);
  calculateScrollPos(this);
  return;
}

Assistant:

void CGUIEditBox::updateAbsolutePosition()
{
	core::rect<s32> oldAbsoluteRect(AbsoluteRect);
	IGUIElement::updateAbsolutePosition();
	if (oldAbsoluteRect != AbsoluteRect) {
		calculateFrameRect();
		breakText();
		calculateScrollPos();
	}
}